

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_20::NameGenerator::NameGenerator(NameGenerator *this,NameOpts opts)

{
  NameOpts opts_local;
  NameGenerator *this_local;
  
  ExprVisitor::DelegateNop::DelegateNop(&this->super_DelegateNop);
  (this->super_DelegateNop).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__NameGenerator_0036c120;
  this->module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&this->visitor_,(Delegate *)this);
  this->label_count_ = 0;
  this->num_func_imports_ = 0;
  this->num_table_imports_ = 0;
  this->num_memory_imports_ = 0;
  this->num_global_imports_ = 0;
  this->num_event_imports_ = 0;
  this->opts_ = opts;
  return;
}

Assistant:

NameGenerator::NameGenerator(NameOpts opts)
  : visitor_(this), opts_(opts) {}